

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

int __thiscall QHeaderView::sectionSizeHint(QHeaderView *this,int logicalIndex)

{
  long lVar1;
  QMetaTypeInterface *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QMetaType QVar6;
  int iVar7;
  void *pvVar8;
  QMetaType *lhs;
  long in_FS_OFFSET;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  uint uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  bVar3 = isSectionHidden(this,logicalIndex);
  iVar7 = 0;
  if ((!bVar3) && (iVar7 = -1, -1 < logicalIndex)) {
    iVar4 = count(this);
    if (logicalIndex < iVar4) {
      pvVar8 = &local_58;
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      (**(code **)(**(long **)(lVar1 + 0x2f8) + 0xa0))
                (pvVar8,*(long **)(lVar1 + 0x2f8),logicalIndex,*(undefined4 *)(lVar1 + 0x548),0xd);
      if (CONCAT44(uStack_3c,uStack_40) < 4) {
        QVar6.d_ptr = (QMetaTypeInterface *)
                      (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                  0x308))(this,logicalIndex);
      }
      else {
        local_68.d_ptr =
             (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
        local_60.d_ptr = (QMetaTypeInterface *)(CONCAT44(uStack_3c,uStack_40) & 0xfffffffffffffffc);
        lhs = &local_60;
        bVar3 = comparesEqual(lhs,&local_68);
        if (bVar3) {
          if ((uStack_40 & 1) == 0) {
            lhs = (QMetaType *)&local_58;
          }
          else {
            lhs = (QMetaType *)
                  ((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                  CONCAT44(local_58._4_4_,local_58._0_4_));
          }
        }
        else {
          local_60.d_ptr = (QMetaTypeInterface *)0xffffffffffffffff;
          QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
          if ((uStack_40 & 1) != 0) {
            pvVar8 = (void *)((long)*(int *)(CONCAT44(local_58._4_4_,local_58._0_4_) + 4) +
                             CONCAT44(local_58._4_4_,local_58._0_4_));
          }
          QMetaType::convert(QVar6,pvVar8,local_68,lhs);
        }
        QVar6.d_ptr = lhs->d_ptr;
      }
      pQVar2 = QVar6.d_ptr >> 0x20;
      if (*(int *)(lVar1 + 0x548) == 1) {
        pQVar2 = QVar6.d_ptr;
      }
      iVar5 = minimumSectionSize(this);
      iVar4 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x608);
      iVar7 = 0xfffff;
      if (iVar4 != -1) {
        iVar7 = iVar4;
      }
      if ((int)pQVar2 <= iVar7) {
        iVar7 = (int)pQVar2;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QHeaderView::sectionSizeHint(int logicalIndex) const
{
    Q_D(const QHeaderView);
    if (isSectionHidden(logicalIndex))
        return 0;
    if (logicalIndex < 0 || logicalIndex >= count())
        return -1;
    QSize size;
    QVariant value = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (value.isValid())
        size = qvariant_cast<QSize>(value);
    else
        size = sectionSizeFromContents(logicalIndex);
    int hint = d->orientation == Qt::Horizontal ? size.width() : size.height();
    return qBound(minimumSectionSize(), hint, maximumSectionSize());
}